

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O3

int ffgcrd(fitsfile *fptr,char *name,char *card,int *status)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  __int32_t **pp_Var7;
  undefined4 extraout_var;
  char cVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  char *pcVar15;
  int iVar16;
  int iVar17;
  bool bVar18;
  int match;
  int cardlen;
  int nextkey;
  char keyname [75];
  int exact;
  int nkeys;
  char cardname [75];
  uint local_134;
  int local_10c;
  uint local_108;
  int local_104;
  ulong local_100;
  ulong local_f8;
  undefined8 local_f0;
  char local_e8;
  undefined7 uStack_e7;
  char local_e0 [80];
  int local_90;
  int local_8c;
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  local_e8 = '\0';
  pcVar14 = name + -1;
  do {
    pcVar15 = pcVar14 + 1;
    pcVar14 = pcVar14 + 1;
  } while (*pcVar15 == ' ');
  pcVar15 = &local_e8;
  strncat(pcVar15,pcVar14,0x4a);
  sVar6 = strlen(pcVar15);
  local_134 = (int)(uint)sVar6 >> 0x1f & (uint)sVar6;
  lVar12 = (sVar6 & 0xffffffff) + 1;
  do {
    if ((int)lVar12 + -1 < 1) {
      (&local_e8)[(int)local_134] = '\0';
      goto LAB_00166adf;
    }
    lVar11 = lVar12 + -1;
    lVar3 = lVar12 + 6;
    lVar12 = lVar11;
  } while (*(char *)((long)&local_f0 + lVar3) == ' ');
  local_134 = (uint)lVar11;
  (&local_e8)[local_134 & 0x7fffffff] = '\0';
  pp_Var7 = __ctype_toupper_loc();
  uVar9 = 0;
  do {
    (&local_e8)[uVar9] = (char)(*pp_Var7)[(&local_e8)[uVar9]];
    uVar9 = uVar9 + 1;
  } while ((local_134 & 0x7fffffff) != uVar9);
LAB_00166adf:
  if ((local_e8 == 'H') && (CONCAT71(uStack_e7,0x48) == 0x4843524152454948)) {
    if (local_134 != 8) {
      pcVar14 = local_e0;
      do {
        cVar8 = *pcVar14;
        pcVar14 = pcVar14 + 1;
      } while (cVar8 == ' ');
      lVar12 = 0;
      if (cVar8 != '\0') {
        do {
          lVar11 = lVar12;
          (&local_e8)[lVar11] = cVar8;
          cVar8 = pcVar14[lVar11];
          lVar12 = lVar11 + 1;
        } while (cVar8 != '\0');
        pcVar15 = local_e0 + lVar11 + -7;
      }
      local_134 = (uint)lVar12;
      *pcVar15 = '\0';
      goto LAB_00166b3c;
    }
    bVar2 = false;
    uVar10 = 8;
  }
  else {
LAB_00166b3c:
    bVar2 = true;
    uVar10 = local_134;
    if (8 < (int)local_134) {
      bVar1 = false;
      bVar18 = true;
      goto LAB_00166b7f;
    }
  }
  pcVar14 = strchr(&local_e8,0x3f);
  bVar1 = true;
  local_134 = uVar10;
  if (pcVar14 == (char *)0x0) {
    pcVar14 = strchr(&local_e8,0x2a);
    if (pcVar14 == (char *)0x0) {
      pcVar14 = strchr(&local_e8,0x23);
      bVar18 = pcVar14 == (char *)0x0;
      bVar1 = !bVar18;
    }
    else {
      bVar18 = false;
      local_134 = uVar10 - 2;
      bVar1 = true;
    }
  }
  else {
    bVar18 = false;
  }
LAB_00166b7f:
  ffghps(fptr,&local_8c,&local_104,status);
  uVar4 = 2;
  if (2 < (int)uVar10) {
    uVar4 = uVar10;
  }
  local_f8 = (ulong)(uVar4 - 1);
  iVar17 = (local_8c - local_104) + 1;
  local_100 = 0;
  local_f0 = fptr;
  do {
    if (0 < iVar17) {
      iVar16 = 0;
      do {
        ffgnky(fptr,card,status);
        if (bVar2) {
          ffgknm(card,local_88,(int *)&local_108,status);
          uVar4 = local_108;
          uVar9 = (ulong)local_108;
          if (!(bool)(local_108 != uVar10 & bVar18) && (int)local_134 <= (int)local_108) {
            if (0 < (int)local_108) {
              uVar13 = 0;
              do {
                cVar8 = local_88[uVar13];
                if (0x60 < (long)cVar8) {
                  pp_Var7 = __ctype_toupper_loc();
                  local_88[uVar13] = (char)(*pp_Var7)[cVar8];
                }
                uVar13 = uVar13 + 1;
              } while (uVar9 != uVar13);
            }
            if (bVar18) {
              fptr = local_f0;
              if ((&local_e8)[local_f8] == local_88[local_f8]) {
                if (local_e8 == local_88[0]) {
                  pcVar14 = &local_e8;
                  uVar9 = local_f8;
                  pcVar15 = local_88;
                  goto LAB_00166ccd;
                }
              }
              else if (uVar4 == 0 && uVar10 == 0) goto LAB_00166d68;
            }
            else {
              ffcmps(&local_e8,local_88,1,&local_10c,&local_90);
              fptr = local_f0;
              if (local_10c != 0) goto LAB_00166d68;
            }
          }
        }
        else if (*card == 'H') {
          uVar9 = 8;
          pcVar14 = "HIERARCH";
          pcVar15 = card;
LAB_00166ccd:
          iVar5 = strncmp(pcVar14,pcVar15,uVar9);
          if (iVar5 == 0) {
LAB_00166d68:
            return *status;
          }
        }
        iVar16 = iVar16 + 1;
      } while (iVar16 != iVar17);
    }
    if ((local_100 & 1) != 0 || bVar1) {
      *status = 0xca;
      return 0xca;
    }
    iVar16 = ffmaky(fptr,1,status);
    iVar17 = local_104 + -1;
    local_100 = CONCAT71((int7)(CONCAT44(extraout_var,iVar16) >> 8),1);
  } while( true );
}

Assistant:

int ffgcrd( fitsfile *fptr,     /* I - FITS file pointer        */
            const char *name,         /* I - name of keyword to read  */
            char *card,         /* O - keyword card             */
            int  *status)       /* IO - error status            */
/*
  Read (get) the named keyword, returning the entire keyword card up to
  80 characters long.  
  The returned card value is null terminated with any trailing blank 
  characters removed.

  If the input name contains wild cards ('?' matches any single char
  and '*' matches any sequence of chars, # matches any string of decimal
  digits) then the search ends once the end of header is reached and does 
  not automatically resume from the top of the header.
*/
{
    int nkeys, nextkey, ntodo, namelen, namelen_limit, namelenminus1, cardlen;
    int ii = 0, jj, kk, wild, match, exact, hier = 0;
    char keyname[FLEN_KEYWORD], cardname[FLEN_KEYWORD];
    char *ptr1, *ptr2, *gotstar;

    if (*status > 0)
        return(*status);

    *keyname = '\0';
    
    while (name[ii] == ' ')  /* skip leading blanks in name */
        ii++;

    strncat(keyname, &name[ii], FLEN_KEYWORD - 1);

    namelen = strlen(keyname);

    while (namelen > 0 && keyname[namelen - 1] == ' ')
         namelen--;            /* ignore trailing blanks in name */

    keyname[namelen] = '\0';  /* terminate the name */

    for (ii=0; ii < namelen; ii++)       
        keyname[ii] = toupper(keyname[ii]);    /*  make upper case  */

    if (FSTRNCMP("HIERARCH", keyname, 8) == 0)
    {
        if (namelen == 8)
        {
            /* special case: just looking for any HIERARCH keyword */
            hier = 1;
        }
        else
        {
            /* ignore the leading HIERARCH and look for the 'real' name */
            /* starting with first non-blank character following HIERARCH */
            ptr1 = keyname;
            ptr2 = &keyname[8];

            while(*ptr2 == ' ')
                ptr2++;

            namelen = 0;
            while(*ptr2)
            {
                *ptr1 = *ptr2;
                 ptr1++;
                 ptr2++;
                 namelen++;
            }
            *ptr1 = '\0';
        }
    }

    /* does input name contain wild card chars?  ('?',  '*', or '#') */
    /* wild cards are currently not supported with HIERARCH keywords */

    namelen_limit = namelen;
    gotstar = 0;
    if (namelen < 9 && 
       (strchr(keyname,'?') || (gotstar = strchr(keyname,'*')) || 
        strchr(keyname,'#')) )
    {
        wild = 1;

        /* if we found a '*' wild card in the name, there might be */
        /* more than one.  Support up to 2 '*' in the template. */
        /* Thus we need to compare keywords whose names have at least */
        /* namelen - 2 characters.                                   */
        if (gotstar)
           namelen_limit -= 2;           
    }
    else
        wild = 0;

    ffghps(fptr, &nkeys, &nextkey, status); /* get no. keywords and position */

    namelenminus1 = maxvalue(namelen - 1, 1);
    ntodo = nkeys - nextkey + 1;  /* first, read from next keyword to end */
    for (jj=0; jj < 2; jj++)
    {
      for (kk = 0; kk < ntodo; kk++)
      {
        ffgnky(fptr, card, status);     /* get next keyword */

        if (hier)
        {
           if (FSTRNCMP("HIERARCH", card, 8) == 0)
                return(*status);  /* found a HIERARCH keyword */
        }
        else
        {
          ffgknm(card, cardname, &cardlen, status); /* get the keyword name */

          if (cardlen >= namelen_limit)  /* can't match if card < name */
          { 
            /* if there are no wild cards, lengths must be the same */
            if (!( !wild && cardlen != namelen) )
            {
              for (ii=0; ii < cardlen; ii++)
              {    
                /* make sure keyword is in uppercase */
                if (cardname[ii] > 96)
                {
                  /* This assumes the ASCII character set in which */
                  /* upper case characters start at ASCII(97)  */
                  /* Timing tests showed that this is 20% faster */
                  /* than calling the isupper function.          */

                  cardname[ii] = toupper(cardname[ii]);  /* make upper case */
                }
              }

              if (wild)
              {
                ffcmps(keyname, cardname, 1, &match, &exact);
                if (match)
                    return(*status); /* found a matching keyword */
              }
              else if (keyname[namelenminus1] == cardname[namelenminus1])
              {
                /* test the last character of the keyword name first, on */
                /* the theory that it is less likely to match then the first */
                /* character since many keywords begin with 'T', for example */

                if (FSTRNCMP(keyname, cardname, namelenminus1) == 0)
                {
                  return(*status);   /* found the matching keyword */
                }
              }
	      else if (namelen == 0 && cardlen == 0)
	      {
	         /* matched a blank keyword */
		 return(*status);
	      }
            }
          }
        }
      }

      if (wild || jj == 1)
            break;  /* stop at end of header if template contains wildcards */

      ffmaky(fptr, 1, status);  /* reset pointer to beginning of header */
      ntodo = nextkey - 1;      /* number of keyword to read */ 
    }

    return(*status = KEY_NO_EXIST);  /* couldn't find the keyword */
}